

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument.hpp
# Opt level: O3

void __thiscall
boost::runtime::
typed_argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~typed_argument(typed_argument<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_argument)._vptr_argument = (_func_int **)&PTR__typed_argument_001ca350;
  pcVar2 = (this->p_value).
           super_class_property<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .value._M_dataplus._M_p;
  paVar1 = &(this->p_value).
            super_class_property<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            .value.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x30);
  return;
}

Assistant:

explicit typed_argument( T const& v )
    : argument( rtti::type_id<T>() )
    , p_value( v )
    {}